

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteDouble
               (int field_number,double value,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteVarint32(output,field_number * 8 + 1);
  io::CodedOutputStream::WriteLittleEndian64(output,(uint64)value);
  return;
}

Assistant:

void WireFormatLite::WriteDouble(int field_number, double value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteDoubleNoTag(value, output);
}